

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall brynet::net::EventLoop::reallocEventSize(EventLoop *this,size_t size)

{
  undefined1 auVar1 [16];
  epoll_event *peVar2;
  ulong uVar3;
  
  if (this->mEventEntries != (epoll_event *)0x0) {
    operator_delete__(this->mEventEntries);
    this->mEventEntries = (epoll_event *)0x0;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  peVar2 = (epoll_event *)operator_new__(uVar3);
  this->mEventEntries = peVar2;
  this->mEventEntriesNum = size;
  return;
}

Assistant:

void EventLoop::reallocEventSize(size_t size)
{
    if (mEventEntries != nullptr)
    {
        delete[] mEventEntries;
        mEventEntries = nullptr;
    }

#ifdef PLATFORM_WINDOWS
    mEventEntries = new OVERLAPPED_ENTRY[size];
#else
    mEventEntries = new epoll_event[size];
#endif

    mEventEntriesNum = size;
}